

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlossySpecular.h
# Opt level: O2

RGBColor __thiscall
pm::GlossySpecular::f(GlossySpecular *this,ShadeRecord *sr,Vector3 *wi,Vector3 *wo)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float *in_R8;
  float fVar4;
  _func_int **pp_Var5;
  float fVar6;
  RGBColor RVar7;
  
  (this->super_BRDF)._vptr_BRDF = (_func_int **)0x0;
  *(undefined4 *)&(this->super_BRDF).samplerState_.count_ = 0;
  fVar4 = dot((Vector3 *)&wi[3].y,wo);
  fVar4 = ((wi[4].x + wi[4].x) * fVar4 - wo->z) * in_R8[2] +
          ((wi[3].y + wi[3].y) * fVar4 - wo->x) * *in_R8 +
          ((wi[3].z + wi[3].z) * fVar4 - wo->y) * in_R8[1];
  pp_Var5 = (_func_int **)(ulong)(uint)fVar4;
  fVar6 = 0.0;
  if (0.0 < fVar4) {
    uVar2 = (sr->localHitPoint).y;
    uVar3 = (sr->localHitPoint).z;
    fVar1 = (sr->normal).x;
    fVar6 = (sr->normal).y;
    fVar4 = powf(fVar4,(sr->normal).z);
    fVar6 = (float)uVar2 * fVar6 * fVar4;
    pp_Var5 = (_func_int **)
              CONCAT44(fVar4 * fVar1 * (float)uVar2,fVar4 * (float)uVar2 * (float)uVar3);
    (this->super_BRDF)._vptr_BRDF = pp_Var5;
    *(float *)&(this->super_BRDF).samplerState_.count_ = fVar6;
  }
  RVar7.b = fVar6;
  RVar7._0_8_ = pp_Var5;
  return RVar7;
}

Assistant:

inline RGBColor GlossySpecular::f(const ShadeRecord &sr, const Vector3 &wi, const Vector3 &wo) const
{
	RGBColor L;
	const float nDotWi = dot(sr.normal, wi);
	Vector3 r(-wi + 2.0f * sr.normal * nDotWi);
	const float rDotWo = dot(r, wo);

	if (rDotWo > 0.0f)
		L = ks_ * cs_ * powf(rDotWo, exp_);

	return L;
}